

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O0

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxFastRT(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,char *name)

{
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffff68;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff70;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined8 local_78 [3];
  undefined8 local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxRatioTester(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *in_RDI = &PTR_getName_0089a660;
  local_50 = in_RDI + 0xd;
  local_78[0] = 0x3eb0c6f7a0b5ed8d;
  local_58 = local_78;
  local_60 = 0;
  local_8 = local_58;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff70,
             (double)in_stack_ffffffffffffff68,in_RDI);
  local_38 = in_RDI + 0x14;
  this_00 = (cpp_dec_float<50U,_int,_void> *)0x3c9cd2b297d889bc;
  local_40 = &stack0xffffffffffffff70;
  local_48 = 0;
  local_10 = local_40;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)0x3c9cd2b297d889bc,(double)in_stack_ffffffffffffff68,
             in_RDI);
  local_20 = in_RDI + 0x1b;
  local_28 = &stack0xffffffffffffff68;
  local_30 = 0;
  local_18 = local_28;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (this_00,1e-06,in_RDI);
  *(undefined1 *)(in_RDI + 0x22) = 0;
  return;
}

Assistant:

SPxFastRT(const char* name)
      : SPxRatioTester<R>(name)
      , minStab(SOPLEX_DEFAULT_BND_VIOL)
      , epsilon(SOPLEX_DEFAULT_EPS_ZERO)
      , fastDelta(SOPLEX_DEFAULT_BND_VIOL)
      , iscoid(false)
   {}